

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O1

UINT8 device_start_k051649(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT8 UVar1;
  DEV_DATA DVar2;
  void *pvVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int *piVar8;
  int iVar9;
  k051649_state *info;
  
  DVar2.chipInf = calloc(1,0x108);
  if ((DEV_DATA *)DVar2.chipInf == (DEV_DATA *)0x0) {
    UVar1 = 0xff;
  }
  else {
    *(UINT8 *)((long)DVar2.chipInf + 0x102) = cfg->flags;
    uVar7 = cfg->clock;
    *(uint *)((long)DVar2.chipInf + 0xe4) = uVar7;
    uVar7 = uVar7 >> 4;
    *(uint *)&((DEV_DATA *)((long)DVar2.chipInf + 0xe8))->chipInf = uVar7;
    pvVar3 = malloc(0x2800);
    ((DEV_DATA *)((long)DVar2.chipInf + 0xf0))->chipInf = pvVar3;
    piVar4 = (int *)((long)pvVar3 + 0x1400);
    ((DEV_DATA *)((long)DVar2.chipInf + 0xf8))->chipInf = piVar4;
    uVar6 = 0;
    piVar8 = piVar4;
    do {
      iVar9 = (int)((uVar6 & 0xffffffff) / 5);
      *piVar4 = iVar9;
      *piVar8 = -iVar9;
      uVar6 = uVar6 + 0x80;
      piVar8 = piVar8 + -1;
      piVar4 = piVar4 + 1;
    } while (uVar6 != 0x28000);
    lVar5 = 0x32;
    do {
      *(undefined1 *)((long)DVar2.chipInf + lVar5) = 0;
      lVar5 = lVar5 + 0x2c;
    } while (lVar5 != 0x10e);
    *(void **)DVar2.chipInf = DVar2.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = uVar7;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

static UINT8 device_start_k051649(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	k051649_state *info;

	info = (k051649_state *)calloc(1, sizeof(k051649_state));
	if (info == NULL)
		return 0xFF;

	// get stream channels
	info->mode_plus = cfg->flags;
	info->mclock = cfg->clock;
	info->rate = info->mclock / 16;

	// build the mixer table
	make_mixer_table(info, 5);
	
	k051649_set_mute_mask(info, 0x00);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->rate, &devDef);
	return 0x00;
}